

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O0

real fasttext::distL2(real *x,real *y,int32_t d)

{
  real tmp;
  int i;
  real dist;
  int32_t d_local;
  real *y_local;
  real *x_local;
  
  dist = 0.0;
  for (i = 0; i < d; i = i + 1) {
    dist = (x[i] - y[i]) * (x[i] - y[i]) + dist;
  }
  return dist;
}

Assistant:

real distL2(const real* x, const real* y, int32_t d) {
  real dist = 0;
  for (auto i = 0; i < d; i++) {
    auto tmp = x[i] - y[i];
    dist += tmp * tmp;
  }
  return dist;
}